

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexes.cpp
# Opt level: O0

uint256 * jbcoin::getDirNodeIndex
                    (uint256 *__return_storage_ptr__,uint256 *uDirRoot,uint64_t uNodeIndex)

{
  unsigned_long *in_R8;
  undefined1 local_28 [14];
  undefined2 local_1a;
  uint64_t local_18;
  uint64_t uNodeIndex_local;
  uint256 *uDirRoot_local;
  
  if (uNodeIndex == 0) {
    *(undefined8 *)__return_storage_ptr__->pn = *(undefined8 *)uDirRoot->pn;
    *(undefined8 *)(__return_storage_ptr__->pn + 2) = *(undefined8 *)(uDirRoot->pn + 2);
    *(undefined8 *)(__return_storage_ptr__->pn + 4) = *(undefined8 *)(uDirRoot->pn + 4);
    *(undefined8 *)(__return_storage_ptr__->pn + 6) = *(undefined8 *)(uDirRoot->pn + 6);
  }
  else {
    local_1a = 100;
    local_28._0_8_ = uNodeIndex;
    local_18 = uNodeIndex;
    uNodeIndex_local = (uint64_t)uDirRoot;
    sha512Half<unsigned_short,jbcoin::base_uint<256ul,void>,unsigned_long>
              (__return_storage_ptr__,(jbcoin *)&local_1a,(unsigned_short *)uDirRoot,
               (base_uint<256UL,_void> *)local_28,in_R8);
  }
  return __return_storage_ptr__;
}

Assistant:

uint256
getDirNodeIndex (uint256 const& uDirRoot, const std::uint64_t uNodeIndex)
{
    if (uNodeIndex == 0)
        return uDirRoot;

    return sha512Half(
        std::uint16_t(spaceDirNode),
        uDirRoot,
        std::uint64_t(uNodeIndex));
}